

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

Interval * __thiscall
vkt::shaderexecutor::Functions::Mul::doApply
          (Interval *__return_storage_ptr__,Mul *this,EvalContext *ctx,IArgs *iargs)

{
  Interval *yi;
  Interval *pIVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  ScopedRoundingMode prod_ctx_;
  Interval local_38;
  
  pIVar1 = iargs->a;
  yi = iargs->b;
  if ((pIVar1->m_hasNaN & 1U) == 0) {
    dVar7 = pIVar1->m_lo;
    dVar2 = pIVar1->m_hi;
    if ((((dVar7 <= dVar2) && (dVar7 != -INFINITY)) && (dVar2 != INFINITY)) &&
       ((yi->m_hasNaN & 1U) == 0)) {
      dVar4 = yi->m_lo;
      dVar3 = yi->m_hi;
      if (((dVar4 <= dVar3) && (dVar4 != -INFINITY)) && (dVar3 != INFINITY)) {
        local_38.m_hasNaN = false;
        local_38.m_lo = INFINITY;
        local_38.m_hi = -INFINITY;
        dVar6 = -dVar2;
        dVar5 = dVar6;
        if (dVar6 <= dVar2) {
          dVar5 = dVar7;
        }
        if (0.0 <= dVar5) {
          if (0.0 <= (double)(~-(ulong)(dVar2 < 0.0) & (ulong)dVar4 |
                             (ulong)-dVar3 & -(ulong)(dVar2 < 0.0))) {
            prod_ctx_.m_oldMode = deGetRoundingMode();
            deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
            dVar7 = iargs->a->m_lo;
            dVar2 = iargs->b->m_lo;
            deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
            dVar7 = dVar7 * dVar2;
            local_38.m_hasNaN = NAN(dVar7);
            dVar2 = -INFINITY;
            if (!local_38.m_hasNaN) {
              dVar2 = dVar7;
            }
            dVar4 = INFINITY;
            if (!local_38.m_hasNaN) {
              dVar4 = dVar7;
            }
            pIVar1 = iargs->b;
            dVar7 = iargs->a->m_hi;
          }
          else {
            if (0.0 < (double)(~-(ulong)(dVar2 < dVar6) & (ulong)dVar3 |
                              (ulong)-dVar4 & -(ulong)(dVar2 < dVar6))) goto LAB_007fc4a5;
            prod_ctx_.m_oldMode = deGetRoundingMode();
            deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
            dVar7 = iargs->a->m_hi;
            dVar2 = iargs->b->m_lo;
            deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
            dVar7 = dVar7 * dVar2;
            local_38.m_hasNaN = NAN(dVar7);
            dVar2 = -INFINITY;
            if (!local_38.m_hasNaN) {
              dVar2 = dVar7;
            }
            dVar4 = INFINITY;
            if (!local_38.m_hasNaN) {
              dVar4 = dVar7;
            }
            pIVar1 = iargs->b;
            dVar7 = iargs->a->m_lo;
          }
          dVar7 = dVar7 * pIVar1->m_hi;
          dVar3 = -INFINITY;
          dVar5 = INFINITY;
          if (!NAN(dVar7)) {
            dVar3 = dVar7;
            dVar5 = dVar7;
          }
          local_38.m_hasNaN = (bool)(local_38.m_hasNaN | NAN(dVar7));
          local_38.m_lo =
               (double)(~-(ulong)(dVar4 <= dVar5) & (ulong)dVar5 |
                       (ulong)dVar4 & -(ulong)(dVar4 <= dVar5));
          local_38.m_hi =
               (double)(~-(ulong)(dVar3 <= dVar2) & (ulong)dVar3 |
                       (ulong)dVar2 & -(ulong)(dVar3 <= dVar2));
          tcu::ScopedRoundingMode::~ScopedRoundingMode(&prod_ctx_);
          tcu::FloatFormat::roundOut((Interval *)&prod_ctx_,&ctx->format,&local_38,true);
          tcu::FloatFormat::convert(__return_storage_ptr__,&ctx->format,(Interval *)&prod_ctx_);
          return __return_storage_ptr__;
        }
      }
    }
  }
LAB_007fc4a5:
  FloatFunc2::applyMonotone(__return_storage_ptr__,(FloatFunc2 *)this,ctx,pIVar1,yi);
  return __return_storage_ptr__;
}

Assistant:

Interval	doApply		(const EvalContext&	ctx, const IArgs& iargs) const
	{
		Interval a = iargs.a;
		Interval b = iargs.b;

		// Fast-path for common case
		if (a.isOrdinary() && b.isOrdinary())
		{
			Interval ret;
			if (a.hi() < 0)
			{
				a = -a;
				b = -b;
			}
			if (a.lo() >= 0 && b.lo() >= 0)
			{
				TCU_SET_INTERVAL_BOUNDS(ret, prod,
										prod = iargs.a.lo() * iargs.b.lo(),
										prod = iargs.a.hi() * iargs.b.hi());
				return ctx.format.convert(ctx.format.roundOut(ret, true));
			}
			if (a.lo() >= 0 && b.hi() <= 0)
			{
				TCU_SET_INTERVAL_BOUNDS(ret, prod,
										prod = iargs.a.hi() * iargs.b.lo(),
										prod = iargs.a.lo() * iargs.b.hi());
				return ctx.format.convert(ctx.format.roundOut(ret, true));
			}
		}
		return this->applyMonotone(ctx, iargs.a, iargs.b);
	}